

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_diamondskin(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  if ((double)(int)ch->max_hit * 0.75 <= (double)ch->hit) {
    bVar1 = is_affected(ch,sn);
    if (!bVar1) {
      init_affect(&AStack_88);
      AStack_88.where = 0;
      AStack_88.aftype = 0;
      AStack_88.level = (short)level + 8;
      AStack_88.duration =
           ((short)(uint)((ulong)((long)level * -0x66666667) >> 0x21) -
           (short)((long)level * -0x66666667 >> 0x3f)) + 0x12;
      AStack_88.location = 0;
      AStack_88.owner = (CHAR_DATA *)0x0;
      AStack_88.end_fun = (AFF_FUN *)0x0;
      AStack_88.type = (short)sn;
      iVar2 = dice(5,0x14);
      AStack_88.modifier = (short)(iVar2 << 2) * 5 + 2000;
      AStack_88.mod_name = 8;
      new_affect_to_char(ch,&AStack_88);
      act("$n concentrates, and $s skin hardens into a diamond-like carapace.",ch,(void *)0x0,
          (void *)0x0,0);
      act("The outer layers of your skin become almost impossibly hard.",ch,(void *)0x0,(void *)0x0,
          3);
      bVar1 = is_affected(ch,(int)gsn_stoneskin);
      if (bVar1) {
        switchD_002e4026::default(ch,(int)gsn_stoneskin);
      }
      bVar1 = is_affected(ch,(int)gsn_ironskin);
      if (bVar1) {
        switchD_002e4026::default(ch,(int)gsn_ironskin);
      }
      return;
    }
    txt = "Your skin is already as hard as it can become.\n\r";
  }
  else {
    txt = "You are bleeding too much to harden your skin.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_diamondskin(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	if (!(ch->hit < ch->max_hit * .75))
	{
		if (!is_affected(ch, sn))
		{
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = sn;
			af.aftype = AFT_SPELL;
			af.level = level + 8;
			af.duration = 18 - level / 5;
			af.location = 0;
			af.owner = nullptr;
			af.end_fun = nullptr;
			af.modifier = (dice(5, 20) + 100) * 20;
			af.mod_name = MOD_PROTECTION;
			new_affect_to_char(ch, &af);

			act("$n concentrates, and $s skin hardens into a diamond-like carapace.", ch, 0, 0, TO_ROOM);
			act("The outer layers of your skin become almost impossibly hard.", ch, 0, 0, TO_CHAR);
			if (is_affected(ch, gsn_stoneskin))
				affect_strip(ch, gsn_stoneskin);
			if (is_affected(ch, gsn_ironskin))
				affect_strip(ch, gsn_ironskin);
		}
		else
		{
			send_to_char("Your skin is already as hard as it can become.\n\r", ch);
			return;
		}
	}
	else
	{
		send_to_char("You are bleeding too much to harden your skin.\n\r", ch);
		return;
	}
}